

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WordEmbedding.pb.cc
# Opt level: O2

bool __thiscall
CoreML::Specification::CoreMLModels::WordEmbedding::MergePartialFromCodedStream
          (WordEmbedding *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  bool bVar4;
  uint uVar5;
  uint32 uVar6;
  string *psVar7;
  char cVar8;
  ulong uVar9;
  
LAB_001fe076:
  pbVar3 = input->buffer_;
  uVar6 = 0;
  if (pbVar3 < input->buffer_end_) {
    bVar2 = *pbVar3;
    uVar9 = (ulong)bVar2;
    pbVar1 = pbVar3 + 1;
    uVar5 = (uint)bVar2;
    if ((char)bVar2 < '\x01') {
      uVar6 = (uint)bVar2;
      if ((input->buffer_end_ <= pbVar1) || (uVar6 = uVar5, (~(uint)*pbVar1 & uVar5) < 0x80))
      goto LAB_001fe187;
      uVar9 = (ulong)((uVar5 + (uint)*pbVar1 * 0x80) - 0x80);
      input->buffer_ = pbVar3 + 2;
    }
    else {
      input->buffer_ = pbVar1;
    }
    uVar9 = uVar9 | 0x100000000;
  }
  else {
LAB_001fe187:
    uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
    uVar9 = 0;
    if (uVar6 - 1 < 0x3fff) {
      uVar9 = 0x100000000;
    }
    uVar9 = uVar6 | uVar9;
  }
  uVar6 = (uint32)uVar9;
  if ((uVar9 & 0x100000000) != 0) {
    uVar5 = (uint)(uVar9 >> 3) & 0x1fffffff;
    cVar8 = (char)uVar9;
    if (uVar5 == 100) {
      if (cVar8 != '\"') goto LAB_001fe0d3;
      psVar7 = mutable_modelparameterdata_abi_cxx11_(this);
      bVar4 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar7);
      goto LAB_001fe0f4;
    }
    if (uVar5 == 10) {
      if (cVar8 != 'R') goto LAB_001fe0d3;
      psVar7 = mutable_language_abi_cxx11_(this);
      bVar4 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar7);
      if (!bVar4) {
        return false;
      }
      psVar7 = (this->language_).ptr_;
      bVar4 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                        ((psVar7->_M_dataplus)._M_p,(int)psVar7->_M_string_length,PARSE,
                         "CoreML.Specification.CoreMLModels.WordEmbedding.language");
      if (!bVar4) {
        return false;
      }
      goto LAB_001fe076;
    }
    if ((uVar5 == 1) && (cVar8 == '\b')) {
      bVar4 = google::protobuf::io::CodedInputStream::ReadVarint32(input,&this->revision_);
      goto LAB_001fe0f4;
    }
  }
LAB_001fe0d3:
  if (uVar6 == 0) {
    return true;
  }
  if ((uVar6 & 7) == 4) {
    return true;
  }
  bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar6);
LAB_001fe0f4:
  if (bVar4 == false) {
    return false;
  }
  goto LAB_001fe076;
}

Assistant:

bool WordEmbedding::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.CoreMLModels.WordEmbedding)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // uint32 revision = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &revision_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string language = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_language()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->language().data(), this->language().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.CoreMLModels.WordEmbedding.language"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bytes modelParameterData = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(802u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadBytes(
                input, this->mutable_modelparameterdata()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.CoreMLModels.WordEmbedding)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.CoreMLModels.WordEmbedding)
  return false;
#undef DO_
}